

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

string * google::protobuf::internal::CloneSlow(Arena *arena,string *value)

{
  pointer pcVar1;
  string *psVar2;
  
  if (arena == (Arena *)0x0) {
    psVar2 = (string *)operator_new(0x20);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + value->_M_string_length);
  }
  else {
    psVar2 = (string *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
    (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
    pcVar1 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,pcVar1,pcVar1 + value->_M_string_length);
  }
  return psVar2;
}

Assistant:

std::string* CloneSlow(Arena* arena, const std::string& value) {
  return Arena::Create<std::string>(arena, value);
}